

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseAssembler::embedConstPool(BaseAssembler *this,Label *label,ConstPool *pool)

{
  Logger *pLVar1;
  long lVar2;
  long lVar3;
  CodeWriter data;
  bool bVar4;
  Error EVar5;
  ulong uVar6;
  undefined1 *puVar7;
  Error EStackY_270;
  CodeWriter writer;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [520];
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EStackY_270 = 5;
  }
  else {
    bVar4 = BaseEmitter::isLabelValid
                      (&this->super_BaseEmitter,(label->super_Operand).super_Operand_._baseId);
    if (bVar4) {
      EVar5 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[9])
                        (this,1,(ulong)(uint)pool->_alignment);
      if ((EVar5 == 0) &&
         (EVar5 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[6])(this,label), EVar5 == 0)) {
        uVar6 = pool->_size;
        if (uVar6 == 0) {
          EVar5 = 0;
        }
        else {
          writer._cursor = this->_bufferPtr;
          EVar5 = CodeWriter::ensureSpace(&writer,this,uVar6);
          data._cursor = writer._cursor;
          if (EVar5 == 0) {
            ConstPool::fill(pool,writer._cursor);
            writer._cursor = writer._cursor + uVar6;
            CodeWriter::done(&writer,this);
            pLVar1 = (this->super_BaseEmitter)._logger;
            if (pLVar1 != (Logger *)0x0) {
              lVar2 = 0;
              if (pool->_minItemSize != 0) {
                for (; (pool->_minItemSize >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              lVar3 = 3;
              if ((uint)lVar2 < 3) {
                lVar3 = lVar2;
              }
              local_240 = local_238;
              uStack_250 = 0;
              local_258 = 0x20;
              local_248 = 0x207;
              local_238[0] = 0;
              Formatter::formatData
                        ((String *)&local_258,(pLVar1->_options)._flags,
                         (this->super_BaseEmitter)._environment._arch,
                         dataTypeIdBySize[1L << ((byte)lVar3 & 0x3f)],data._cursor,
                         uVar6 >> ((byte)lVar3 & 0x3f),1);
              String::_opChar((String *)&local_258,kAppend,'\n');
              pLVar1 = (this->super_BaseEmitter)._logger;
              uVar6 = uStack_250;
              puVar7 = local_240;
              if ((local_258 & 0xff) < 0x1f) {
                uVar6 = local_258 & 0xff;
                puVar7 = (undefined1 *)((long)&local_258 + 1);
              }
              (*pLVar1->_vptr_Logger[2])(pLVar1,puVar7,uVar6);
              String::reset((String *)&local_258);
            }
          }
        }
      }
      return EVar5;
    }
    EStackY_270 = 0xc;
  }
  EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,EStackY_270,(char *)0x0);
  return EVar5;
}

Assistant:

Error BaseAssembler::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(!isLabelValid(label)))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  size_t size = pool.size();
  if (!size)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, size));

#ifndef ASMJIT_NO_LOGGING
  uint8_t* data = writer.cursor();
#endif

  pool.fill(writer.cursor());
  writer.advance(size);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    uint32_t dataSizeLog2 = Support::min<uint32_t>(Support::ctz(pool.minItemSize()), 3);
    uint32_t dataSize = 1 << dataSizeLog2;

    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize], data, size >> dataSizeLog2);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}